

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_copyto_snapshot(filemgr *file,snap_handle *shandle,bool is_multi_kv)

{
  byte bVar1;
  bool bVar2;
  void *__dest;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  size_t num_shards;
  size_t i;
  fdb_doc doc;
  fdb_kvs_id_t kv_id;
  wal_item_header *header;
  wal_item *item;
  avl_node *a;
  list_elem *ee;
  wal_item *id;
  wal_item *item_00;
  fdb_txn *in_stack_ffffffffffffff70;
  list *in_stack_ffffffffffffff78;
  fdb_txn *in_stack_ffffffffffffff80;
  avl_node *local_28;
  list_elem *local_20;
  
  item_00 = (wal_item *)0x0;
  id = *(wal_item **)(*(long *)(in_RDI + 0x48) + 0x48);
  *(undefined8 *)(in_RSI + 0x88) = 0;
  *(undefined8 *)(in_RSI + 0x90) = 0;
  do {
    if (id <= item_00) {
      return FDB_RESULT_SUCCESS;
    }
    pthread_spin_lock((pthread_spinlock_t *)
                      (*(long *)(*(long *)(in_RDI + 0x48) + 0x38) + (long)item_00 * 0x18 + 0x10));
    local_28 = avl_first((avl_tree *)
                         (*(long *)(*(long *)(in_RDI + 0x48) + 0x38) + (long)item_00 * 0x18));
    while (local_28 != (avl_node *)0x0) {
      if (((in_DL & 1) == 0) ||
         (buf2kvid((size_t)in_stack_ffffffffffffff70,item_00,(fdb_kvs_id_t *)id),
         *(long *)(in_RSI + 0x18) == 0)) {
        local_20 = list_begin((list *)&local_28[1].right);
        while (local_20 != (list_elem *)0x0) {
          bVar1 = std::__atomic_base::operator_cast_to_unsigned_char
                            ((__atomic_base<unsigned_char> *)item_00);
          if ((((bVar1 & 1) == 0) && (local_20[3].prev != (list_elem *)(in_RDI + 0x130))) &&
             (local_20[3].prev != *(list_elem **)(in_RSI + 0x48))) {
            local_20 = list_next(local_20);
          }
          else {
            bVar2 = _wal_item_partially_committed
                              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                               in_stack_ffffffffffffff70,item_00);
            if (bVar2) {
              local_20 = list_next(local_20);
            }
            else {
              if (local_20[5].next <= *(list_elem **)(in_RSI + 0x40)) {
                in_stack_ffffffffffffff70 = (fdb_txn *)(ulong)*(ushort *)&local_20[2].next[2].prev;
                __dest = malloc((size_t)in_stack_ffffffffffffff70);
                memcpy(__dest,local_20[2].next[1].next,(size_t)in_stack_ffffffffffffff70);
                wal_snap_insert((snap_handle *)doc.size_ondisk,(fdb_doc *)doc.bodylen,doc.metalen,
                                doc.keylen._7_1_);
                break;
              }
              local_20 = list_next(local_20);
            }
          }
        }
        local_28 = avl_next(local_28);
      }
      else {
        local_28 = avl_next(local_28);
      }
    }
    pthread_spin_unlock((pthread_spinlock_t *)
                        (*(long *)(*(long *)(in_RDI + 0x48) + 0x38) + (long)item_00 * 0x18 + 0x10));
    item_00 = (wal_item *)((long)&(item_00->list_elem).prev + 1);
  } while( true );
}

Assistant:

fdb_status wal_copyto_snapshot(struct filemgr *file,
                               struct snap_handle *shandle,
                               bool is_multi_kv)
{
    struct list_elem *ee;
    struct avl_node *a;
    struct wal_item *item;
    struct wal_item_header *header;
    fdb_kvs_id_t kv_id = 0;
    fdb_doc doc;
    size_t i = 0;
    size_t num_shards = file->wal->num_shards;

    shandle->stat.wal_ndocs = 0; // WAL copy will populate
    shandle->stat.wal_ndeletes = 0; // these 2 stats

    // Get the list of active transactions now
    for (; i < num_shards; ++i) {
        spin_lock(&file->wal->key_shards[i].lock);
        a = avl_first(&file->wal->key_shards[i]._map);
        while (a) {
            header = _get_entry(a, struct wal_item_header, avl_key);
            if (is_multi_kv) {
                buf2kvid(header->chunksize, header->key, &kv_id);
                if (kv_id != shandle->id) {
                    a = avl_next(a);
                    continue;
                }
            }
            ee = list_begin(&header->items);
            while (ee) {
                item = _get_entry(ee, struct wal_item, list_elem);
                // Skip any uncommitted item, if not part of either global or
                // the current transaction
                if (!(item->flag & WAL_ITEM_COMMITTED) &&
                        item->txn != &file->global_txn &&
                        item->txn != shandle->snap_txn) {
                    ee = list_next(ee);
                    continue;
                }
                // Skip the partially committed items too.
                if (_wal_item_partially_committed(shandle->global_txn,
                                                  &shandle->active_txn_list,
                                                  shandle->snap_txn, item)) {
                    ee = list_next(ee);
                    continue;
                }

                if (item->seqnum > shandle->seqnum) {
                    ee = list_next(ee);
                    continue;
                }

                doc.keylen = item->header->keylen;
                doc.key = malloc(doc.keylen); // (freed in fdb_snapshot_close)
                memcpy(doc.key, item->header->key, doc.keylen);
                doc.seqnum = item->seqnum;
                doc.deleted = (item->action == WAL_ACT_LOGICAL_REMOVE ||
                               item->action == WAL_ACT_REMOVE);
                wal_snap_insert(shandle, &doc, item->offset, item->action);
                break; // We just require a single latest copy in the snapshot
            }
            a = avl_next(a);
        }
        spin_unlock(&file->wal->key_shards[i].lock);
    }
    return FDB_RESULT_SUCCESS;
}